

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O3

void test_cpp_add_bulk(void **param_1)

{
  uint32_t val;
  _Bool _Var1;
  pointer puVar2;
  initializer_list<unsigned_int> __l;
  vector<unsigned_int,_std::allocator<unsigned_int>_> values;
  BulkContext bulk_context;
  Roaring r2;
  Roaring r1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  roaring_bulk_context_t local_98;
  roaring_array_t local_88;
  roaring_array_t local_58;
  
  local_58.size = 9999;
  local_58.allocation_size = 0x7b;
  local_58.containers = (container_s **)0xfffffff7ffffffff;
  local_58.keys = (uint16_t *)CONCAT44(local_58.keys._4_4_,9999);
  __l._M_len = 5;
  __l._M_array = (iterator)&local_58;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_b0,__l,(allocator_type *)&local_88);
  local_58.keys = (uint16_t *)0x0;
  local_58.typecodes = (uint8_t *)0x0;
  local_58.size = 0;
  local_58.allocation_size = 0;
  local_58.containers = (container_s **)0x0;
  local_58.flags = '\0';
  local_58._33_7_ = 0;
  roaring_bitmap_init_with_capacity((roaring_bitmap_t *)&local_58,0);
  local_88.keys = (uint16_t *)0x0;
  local_88.typecodes = (uint8_t *)0x0;
  local_88.size = 0;
  local_88.allocation_size = 0;
  local_88.containers = (container_s **)0x0;
  local_88.flags = '\0';
  local_88._33_7_ = 0;
  roaring_bitmap_init_with_capacity((roaring_bitmap_t *)&local_88,0);
  local_98.idx = 0;
  local_98.key = 0;
  local_98.typecode = '\0';
  local_98.container._0_7_ = 0;
  local_98.container._7_1_ = 0;
  if (local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar2 = local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      val = *puVar2;
      roaring_bitmap_add_bulk((roaring_bitmap_t *)&local_58,&local_98,val);
      roaring_bitmap_add((roaring_bitmap_t *)&local_88,val);
      _Var1 = roaring_bitmap_equals((roaring_bitmap_t *)&local_58,(roaring_bitmap_t *)&local_88);
      _assert_true((ulong)_Var1,"r1 == r2",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                   ,0x2f8);
      puVar2 = puVar2 + 1;
    } while (puVar2 != local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  roaring::Roaring::~Roaring((Roaring *)&local_88);
  roaring::Roaring::~Roaring((Roaring *)&local_58);
  if (local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

DEFINE_TEST(test_cpp_add_bulk) {
    std::vector<uint32_t> values = {9999, 123, 0xFFFFFFFF, 0xFFFFFFF7, 9999};
    Roaring r1;
    Roaring r2;
    roaring::BulkContext bulk_context;
    for (const auto value : values) {
        r1.addBulk(bulk_context, value);
        r2.add(value);
        assert_true(r1 == r2);
    }
}